

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M3DExporter.cpp
# Opt level: O0

void Assimp::ExportSceneM3DA
               (char *pFile,IOSystem *pIOSystem,aiScene *pScene,ExportProperties *pProperties)

{
  DeadlyImportError *this;
  allocator<char> local_49;
  string local_48;
  ExportProperties *local_28;
  ExportProperties *pProperties_local;
  aiScene *pScene_local;
  IOSystem *pIOSystem_local;
  char *pFile_local;
  
  local_28 = pProperties;
  pProperties_local = (ExportProperties *)pScene;
  pScene_local = (aiScene *)pIOSystem;
  pIOSystem_local = (IOSystem *)pFile;
  this = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"Assimp configured without M3D_ASCII support",&local_49);
  DeadlyImportError::DeadlyImportError(this,&local_48);
  __cxa_throw(this,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void ExportSceneM3DA(
		const char *pFile,
		IOSystem *pIOSystem,
		const aiScene *pScene,
		const ExportProperties *pProperties

) {
#ifdef M3D_ASCII
	// initialize the exporter
	M3DExporter exporter(pScene, pProperties);

	// perform ascii export
	exporter.doExport(pFile, pIOSystem, true);
#else
	throw DeadlyExportError("Assimp configured without M3D_ASCII support");
#endif
}